

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uuid.cpp
# Opt level: O0

void __thiscall BasicUUID_Out_Test::TestBody(BasicUUID_Out_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_1d8;
  Message local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar;
  ostringstream local_188 [8];
  ostringstream str;
  BasicUUID_Out_Test *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  pstore::operator<<((ostream *)local_188,&(this->super_BasicUUID).id_);
  std::__cxx11::ostringstream::str();
  testing::internal::EqHelper::
  Compare<char[37],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_1a8,"\"84949cc5-4701-4a84-895b-354c584a981b\"","str.str ()",
             (char (*) [37])"84949cc5-4701-4a84-895b-354c584a981b",&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_uuid.cpp"
               ,0x36,message);
    testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return;
}

Assistant:

TEST_F (BasicUUID, Out) {
    std::ostringstream str;
    str << id_;
    EXPECT_EQ ("84949cc5-4701-4a84-895b-354c584a981b", str.str ());
}